

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

int __thiscall deqp::egl::ResizeTest::init(ResizeTest *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  EglTestContext *pEVar1;
  NativeDisplay *nativeDisplay;
  NativeWindow *pNVar2;
  CommandLine *cmdLine;
  EGLenum surfaceType;
  int iVar3;
  deUint32 dVar4;
  EGLint EVar5;
  Visibility VVar6;
  int extraout_EAX;
  Library *egl;
  EGLDisplay eglDisplay;
  EGLConfig config;
  undefined4 extraout_var;
  UniqueContext *pUVar7;
  NativeWindowFactory *pNVar8;
  NativeWindow *window;
  EGLSurface surface_00;
  UniqueSurface *pUVar9;
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> surface;
  MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> context;
  EGLint ctxAttribs [3];
  UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> local_1f8;
  UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> local_1e8;
  CommandLine *local_1d8;
  undefined8 local_1d0;
  Visibility local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1d8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine;
  eglDisplay = eglu::getAndInitDisplay
                         ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,(Version *)0x0);
  surfaceType = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  config = getEGLConfig(egl,eglDisplay,surfaceType);
  local_1c0 = 0x200003098;
  local_1b8 = 0x3038;
  iVar3 = (*egl->_vptr_Library[6])(egl,eglDisplay,config,0);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"eglCreateContext()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x9e);
  pUVar7 = (UniqueContext *)operator_new(0x18);
  eglu::UniqueContext::UniqueContext(pUVar7,egl,eglDisplay,(EGLContext)CONCAT44(extraout_var,iVar3))
  ;
  local_1e8.m_data.ptr = pUVar7;
  EVar5 = eglu::getConfigAttribInt(egl,eglDisplay,config,0x3028);
  cmdLine = local_1d8;
  VVar6 = eglu::parseWindowVisibility(local_1d8);
  pEVar1 = (this->super_TestCase).m_eglTestCtx;
  nativeDisplay =
       (pEVar1->m_nativeDisplay).
       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.ptr;
  pNVar8 = eglu::selectNativeWindowFactory(pEVar1->m_nativeDisplayFactory,cmdLine);
  local_1d0 = *(undefined8 *)(this->m_oldSize).m_data;
  local_1c8 = VVar6;
  iVar3 = (*(pNVar8->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar8,nativeDisplay,eglDisplay,config);
  window = (NativeWindow *)CONCAT44(extraout_var_00,iVar3);
  surface_00 = eglu::createWindowSurface(nativeDisplay,window,eglDisplay,config,(EGLAttrib *)0x0);
  pUVar9 = (UniqueSurface *)operator_new(0x18);
  eglu::UniqueSurface::UniqueSurface(pUVar9,egl,eglDisplay,surface_00);
  local_1b0._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1f8.m_data.ptr = pUVar9;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Chose EGLConfig with id ",0x18);
  std::ostream::operator<<(this_00,EVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Created initial surface with size ",0x22);
  tcu::operator<<((ostream *)this_00,&this->m_oldSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2);
  pUVar9 = local_1f8.m_data.ptr;
  this->m_config = config;
  local_1f8.m_data.ptr = (UniqueSurface *)0x0;
  if ((this->m_surface).
      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr !=
      pUVar9) {
    de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::reset
              (&(this->m_surface).
                super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>);
    (this->m_surface).
    super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr =
         pUVar9;
  }
  pUVar7 = local_1e8.m_data.ptr;
  local_1e8.m_data.ptr = (UniqueContext *)0x0;
  if ((this->m_context).
      super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data.ptr !=
      pUVar7) {
    de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::reset
              (&(this->m_context).
                super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>);
    (this->m_context).
    super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data.ptr =
         pUVar7;
  }
  this->m_display = eglDisplay;
  pNVar2 = (this->m_nativeWindow).
           super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr;
  if (pNVar2 != window) {
    if (pNVar2 != (NativeWindow *)0x0) {
      (*pNVar2->_vptr_NativeWindow[1])();
    }
    (this->m_nativeWindow).
    super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr =
         window;
  }
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"init",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0xc1);
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::reset
            (&local_1f8);
  de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::reset
            (&local_1e8);
  return extraout_EAX;
}

Assistant:

void ResizeTest::init (void)
{
	TestCase::init();

	const Library&				egl				= m_eglTestCtx.getLibrary();
	const CommandLine&			cmdLine			= m_testCtx.getCommandLine();
	const EGLDisplay			eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	const EGLConfig				eglConfig		= getEGLConfig(egl, eglDisplay, surfaceType());
	const EGLint				ctxAttribs[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};
	EGLContext					eglContext		= egl.createContext(eglDisplay,
																   eglConfig,
																   EGL_NO_CONTEXT,
																   ctxAttribs);
	EGLU_CHECK_MSG(egl, "eglCreateContext()");
	MovePtr<UniqueContext>		context			(new UniqueContext(egl, eglDisplay, eglContext));
	const EGLint				configId		= eglu::getConfigAttribInt(egl,
																		   eglDisplay,
																		   eglConfig,
																		   EGL_CONFIG_ID);
	const Visibility			visibility		= eglu::parseWindowVisibility(cmdLine);
	NativeDisplay&				nativeDisplay	= m_eglTestCtx.getNativeDisplay();
	const NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(),
																				  cmdLine);

	const WindowParams			windowParams	(m_oldSize.x(), m_oldSize.y(), visibility);
	MovePtr<NativeWindow>		nativeWindow	(windowFactory.createWindow(&nativeDisplay,
																			 eglDisplay,
																			 eglConfig,
																			 DE_NULL,
																			 windowParams));
	const EGLSurface			eglSurface		= eglu::createWindowSurface(nativeDisplay,
																			*nativeWindow,
																			eglDisplay,
																			eglConfig,
																			DE_NULL);
	MovePtr<UniqueSurface>		surface			(new UniqueSurface(egl, eglDisplay, eglSurface));

	m_log << TestLog::Message
		  << "Chose EGLConfig with id " << configId << ".\n"
		  << "Created initial surface with size " << m_oldSize
		  << TestLog::EndMessage;

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2, 0));
	m_config		= eglConfig;
	m_surface		= surface;
	m_context		= context;
	m_display		= eglDisplay;
	m_nativeWindow	= nativeWindow;
	EGLU_CHECK_MSG(egl, "init");
}